

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O2

void resampler_write_sample_fixed(void *_r,int s,uchar depth)

{
  int iVar1;
  float fVar2;
  uint uVar3;
  
  if (*(char *)((long)_r + 0x31) < '\0') {
    *(undefined1 *)((long)_r + 0x31) = 0;
    uVar3 = 0xf;
    if (*(char *)((long)_r + 0x30) != '\x05') {
      uVar3 = (uint)(*(char *)((long)_r + 0x30) == '\x04');
    }
  }
  else {
    uVar3 = *(uint *)((long)_r + 4);
    if (0x3f < (int)*(uint *)((long)_r + 4)) {
      return;
    }
  }
  fVar2 = (float)s / (float)(1 << (depth - 1 & 0x1f));
  iVar1 = *_r;
  *(float *)((long)_r + (long)iVar1 * 4 + 0x48) = fVar2;
  *(float *)((long)_r + (long)iVar1 * 4 + 0x148) = fVar2;
  *(uint *)((long)_r + 4) = uVar3 + 1;
  *(int *)_r = (iVar1 + 1) % 0x40;
  return;
}

Assistant:

void resampler_write_sample_fixed(void *_r, int s, unsigned char depth)
{
    resampler * r = ( resampler * ) _r;
    
    if ( r->delay_added < 0 )
    {
        r->delay_added = 0;
        r->write_filled = resampler_input_delay( r );
    }
    
    if ( r->write_filled < resampler_buffer_size )
    {
        double s32 = s;
        s32 /= (double)(1 << (depth - 1));
        
        r->buffer_in[ r->write_pos ] = (float)s32;
        r->buffer_in[ r->write_pos + resampler_buffer_size ] = (float)s32;
        
        ++r->write_filled;
        
        r->write_pos = ( r->write_pos + 1 ) % resampler_buffer_size;
    }
}